

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_builder.cc
# Opt level: O1

void __thiscall leveldb::BlockBuilder::Add(BlockBuilder *this,Slice *key,Slice *value)

{
  string *psVar1;
  iterator __position;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  uint local_3c;
  string *local_38;
  
  local_38 = &this->last_key_;
  if (this->counter_ < this->options_->block_restart_interval) {
    uVar3 = (this->last_key_)._M_string_length;
    if (key->size_ < uVar3) {
      uVar3 = key->size_;
    }
    if (uVar3 != 0) {
      uVar4 = 0;
      do {
        uVar5 = uVar4;
        if ((this->last_key_)._M_dataplus._M_p[uVar4] != key->data_[uVar4]) break;
        uVar4 = uVar4 + 1;
        uVar5 = uVar3;
      } while (uVar3 != uVar4);
      goto LAB_0012272b;
    }
  }
  else {
    local_3c = (uint)(this->buffer_)._M_string_length;
    __position._M_current =
         (this->restarts_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->restarts_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&this->restarts_,__position,&local_3c);
    }
    else {
      *__position._M_current = local_3c;
      (this->restarts_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = __position._M_current + 1;
    }
    this->counter_ = 0;
  }
  uVar5 = 0;
LAB_0012272b:
  sVar2 = key->size_;
  psVar1 = &this->buffer_;
  PutVarint32(psVar1,(uint32_t)uVar5);
  PutVarint32(psVar1,(int)sVar2 - (uint32_t)uVar5);
  PutVarint32(psVar1,(uint32_t)value->size_);
  std::__cxx11::string::append((char *)psVar1,(ulong)(key->data_ + uVar5));
  std::__cxx11::string::append((char *)psVar1,(ulong)value->data_);
  psVar1 = local_38;
  std::__cxx11::string::resize((ulong)local_38,(char)uVar5);
  std::__cxx11::string::append((char *)psVar1,(ulong)(key->data_ + uVar5));
  this->counter_ = this->counter_ + 1;
  return;
}

Assistant:

void BlockBuilder::Add(const Slice& key, const Slice& value) {
  Slice last_key_piece(last_key_);
  assert(!finished_);
  assert(counter_ <= options_->block_restart_interval);
  assert(buffer_.empty()  // No values yet?
         || options_->comparator->Compare(key, last_key_piece) > 0);
  size_t shared = 0;
  if (counter_ < options_->block_restart_interval) {
    // See how much sharing to do with previous string
    const size_t min_length = std::min(last_key_piece.size(), key.size());
    while ((shared < min_length) && (last_key_piece[shared] == key[shared])) {
      shared++;
    }
  } else {
    // Restart compression
    restarts_.push_back((uint32_t)buffer_.size());
    counter_ = 0;
  }
  const size_t non_shared = key.size() - shared;

  // Add "<shared><non_shared><value_size>" to buffer_
  PutVarint32(&buffer_, (uint32_t)shared);
  PutVarint32(&buffer_, (uint32_t)non_shared);
  PutVarint32(&buffer_, (uint32_t)value.size());

  // Add string delta to buffer_ followed by value
  buffer_.append(key.data() + shared, non_shared);
  buffer_.append(value.data(), value.size());

  // Update state
  last_key_.resize(shared);
  last_key_.append(key.data() + shared, non_shared);
  assert(Slice(last_key_) == key);
  counter_++;
}